

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

void h265e_dpb_proc_cpb(H265eDpb *dpb,EncCpbStatus *cpb)

{
  bool bVar1;
  EncFrmStatus *frm_00;
  H265eDpbFrm *pHVar2;
  ulong uVar3;
  H265eDpbFrm *frame_3;
  H265eDpbFrm *frame_1;
  H265eDpbFrm *frame_2;
  EncFrmStatus *frm;
  H265eDpbFrm *frame;
  int local_38;
  RK_S32 max_poc;
  RK_S32 max_gop_id;
  RK_U32 need_rebuild;
  H265eDpbFrm *p;
  RK_U32 i;
  RK_U32 index;
  EncFrmStatus *curr;
  EncCpbStatus *cpb_local;
  H265eDpb *dpb_local;
  
  bVar1 = false;
  local_38 = 0;
  frame._4_4_ = 0;
  if ((dpb != (H265eDpb *)0x0) && (cpb != (EncCpbStatus *)0x0)) {
    if (((cpb->curr).val >> 5 & 1) == 0) {
      for (p._0_4_ = 0; (uint)p < 8; p._0_4_ = (uint)p + 1) {
        frm_00 = cpb->init + (uint)p;
        if ((frm_00->val & 1) != 0) {
          if (((frm_00->val >> 6 & 1) != 0) &&
             (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "!frm->is_non_ref","h265e_dpb_proc_cpb",0x30c),
             (mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          if ((h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",(char *)0x0,
                       (ulong)(uint)p,frm_00->val >> 0x30,(uint)frm_00->val & 1,
                       (uint)(frm_00->val >> 6) & 1,(uint)(frm_00->val >> 7) & 1);
          }
          pHVar2 = h265e_find_cpb_in_dpb(dpb->frame_list,0x10,frm_00);
          if (((uint)pHVar2->field_7 & 0xff) == 0) {
            *(ushort *)&pHVar2->field_7 = *(ushort *)&pHVar2->field_7 & 0xff00 | 1;
            (pHVar2->status).val = *(RK_U64 *)frm_00;
            pHVar2->slice->is_referenced = 1;
            bVar1 = true;
          }
        }
      }
      if (bVar1) {
        if ((h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","cpb roll back found",(char *)0x0);
        }
        for (p._4_4_ = 0; p._4_4_ < 0x11; p._4_4_ = p._4_4_ + 1) {
          uVar3 = (ulong)p._4_4_;
          if (((uint)dpb->frame_list[uVar3].field_7 & 0xff) != 0) {
            if (frame._4_4_ < (dpb->frame_list[uVar3].slice)->poc) {
              frame._4_4_ = (dpb->frame_list[uVar3].slice)->poc;
            }
            if (local_38 < (dpb->frame_list[uVar3].slice)->gop_idx) {
              local_38 = (dpb->frame_list[uVar3].slice)->gop_idx;
            }
          }
        }
        pHVar2 = dpb->curr;
        if (pHVar2->inited != 0) {
          pHVar2->slice->is_referenced = 0;
          pHVar2->is_long_term = 0;
          pHVar2->used_by_cur = 0;
          *(ushort *)&pHVar2->field_7 = *(ushort *)&pHVar2->field_7 & 0xff00;
          (pHVar2->status).val = 0;
        }
        dpb->seq_idx = frame._4_4_;
        dpb->gop_idx = local_38;
      }
      for (p._4_4_ = 0; p._4_4_ < 0x11; p._4_4_ = p._4_4_ + 1) {
        uVar3 = (ulong)p._4_4_;
        if ((dpb->frame_list[uVar3].inited != 0) &&
           (((uint)dpb->frame_list[uVar3].field_7 & 0xff) == 0)) {
          if ((h265e_debug & 0x80) != 0) {
            _mpp_log_l(4,"h265e_dpb","reset index %d frame->inited %d rame->on_used %x",(char *)0x0,
                       (ulong)p._4_4_,(ulong)dpb->frame_list[uVar3].inited,
                       dpb->frame_list[uVar3].field_7.on_used);
          }
          dpb->frame_list[uVar3].status.val = 0;
        }
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < 0x11; p._4_4_ = p._4_4_ + 1) {
        uVar3 = (ulong)p._4_4_;
        if (dpb->frame_list[uVar3].inited != 0) {
          (dpb->frame_list[uVar3].slice)->is_referenced = 0;
          dpb->frame_list[uVar3].is_long_term = 0;
          dpb->frame_list[uVar3].used_by_cur = 0;
          *(ushort *)&dpb->frame_list[uVar3].field_7 =
               *(ushort *)&dpb->frame_list[uVar3].field_7 & 0xff00;
          dpb->frame_list[uVar3].status.val = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void h265e_dpb_proc_cpb(H265eDpb *dpb, EncCpbStatus *cpb)
{
    EncFrmStatus *curr = &cpb->curr;
    RK_U32 index = 0, i = 0;
    H265eDpbFrm *p = NULL;
    RK_U32 need_rebuild = 0;
    RK_S32 max_gop_id = 0, max_poc = 0;

    if (!dpb || !cpb)
        return;

    if (curr->is_idr) {
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];
            if (frame->inited) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                frame->used_by_cur = 0;
                frame->dpb_used = 0;
                frame->status.val = 0;
            }
        }
        return;
    }

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h265e_dbg_dpb("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                      i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        p = h265e_find_cpb_in_dpb(dpb->frame_list, MAX_REFS, frm);
        if (!p->dpb_used) {
            p->dpb_used = 1;
            p->status.val = frm->val;
            p->slice->is_referenced = 1;
            need_rebuild = 1;
        }
    }

    if (need_rebuild) {
        h265e_dbg_dpb("cpb roll back found");
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];

            if (frame->dpb_used) {
                if (max_poc < frame->slice->poc) {
                    max_poc = frame->slice->poc;
                }
                if (max_gop_id < frame->slice->gop_idx) {
                    max_gop_id = frame->slice->gop_idx;
                }
            }
        }

        H265eDpbFrm *frame = dpb->curr;

        if (frame->inited) {
            frame->slice->is_referenced = 0;
            frame->is_long_term = 0;
            frame->used_by_cur = 0;
            frame->dpb_used = 0;
            frame->status.val = 0;
        }
        dpb->seq_idx = max_poc;
        dpb->gop_idx = max_gop_id;
    }

    for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
        H265eDpbFrm *frame = &dpb->frame_list[index];

        if (frame->inited && !frame->dpb_used) {
            h265e_dbg_dpb("reset index %d frame->inited %d rame->on_used %x",
                          index, frame->inited, frame->on_used);
            frame->status.val = 0;
        }
    }
}